

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_test.cpp
# Opt level: O0

void evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
               (rt_expr<viennamath::rt_expression_interface<double>_> *e,double ref_solution)

{
  bool bVar1;
  reference pvVar2;
  ostream *poVar3;
  ct_constant<8L> *in_R8;
  numeric_type nVar4;
  numeric_type nVar5;
  numeric_type nVar6;
  ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
  local_170;
  byte local_141;
  rt_expr<viennamath::rt_expression_interface<double>_> local_140;
  ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
  local_138;
  rt_expr<viennamath::rt_expression_interface<double>_> local_110;
  ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
  local_108;
  rt_expr<viennamath::rt_expression_interface<double>_> local_e0;
  ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
  local_d8;
  ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
  local_b0;
  byte local_81;
  rt_expr<viennamath::rt_expression_interface<double>_> local_80;
  rt_expr<viennamath::rt_expression_interface<double>_> local_78;
  rt_expr<viennamath::rt_expression_interface<double>_> local_70;
  allocator<double> local_61;
  undefined1 local_60 [8];
  vector<double,_std::allocator<double>_> p;
  ct_constant<8L> c8;
  undefined1 local_38 [8];
  rt_constant<long,_viennamath::rt_expression_interface<double>_> c6;
  rt_constant<double,_viennamath::rt_expression_interface<double>_> c4;
  double ref_solution_local;
  rt_expr<viennamath::rt_expression_interface<double>_> *e_local;
  
  viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>::rt_constant
            ((rt_constant<double,_viennamath::rt_expression_interface<double>_> *)&c6.s,4.0);
  viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>::rt_constant
            ((rt_constant<long,_viennamath::rt_expression_interface<double>_> *)local_38,6);
  viennamath::ct_constant<8L>::ct_constant
            ((ct_constant<8L> *)
             ((long)&p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  std::allocator<double>::allocator(&local_61);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_60,3,&local_61);
  std::allocator<double>::~allocator(&local_61);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_60,0);
  *pvVar2 = 4.0;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_60,1);
  *pvVar2 = 6.0;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_60,2);
  *pvVar2 = 8.0;
  poVar3 = viennamath::operator<<((ostream *)&std::cout,e);
  poVar3 = std::operator<<(poVar3," at STL (");
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_60,0);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar2);
  poVar3 = std::operator<<(poVar3,", ");
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_60,1);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar2);
  poVar3 = std::operator<<(poVar3,", ");
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_60,2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar2);
  poVar3 = std::operator<<(poVar3,")");
  poVar3 = std::operator<<(poVar3," = ");
  nVar4 = viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator()
                    (e,(vector<double,_std::allocator<double>_> *)local_60);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,nVar4);
  poVar3 = std::operator<<(poVar3," = ");
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr(&local_70,e);
  nVar5 = viennamath::
          eval<viennamath::rt_expression_interface<double>,std::vector<double,std::allocator<double>>>
                    (&local_70,(vector<double,_std::allocator<double>_> *)local_60);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,nVar5);
  poVar3 = std::operator<<(poVar3," (reference solution: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,ref_solution);
  poVar3 = std::operator<<(poVar3,")");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::~rt_expr(&local_70);
  local_81 = 0;
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr(&local_78,e);
  nVar5 = viennamath::
          eval<viennamath::rt_expression_interface<double>,std::vector<double,std::allocator<double>>>
                    (&local_78,(vector<double,_std::allocator<double>_> *)local_60);
  bVar1 = false;
  if (nVar5 <= ref_solution) {
    viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr(&local_80,e);
    local_81 = 1;
    nVar5 = viennamath::
            eval<viennamath::rt_expression_interface<double>,std::vector<double,std::allocator<double>>>
                      (&local_80,(vector<double,_std::allocator<double>_> *)local_60);
    bVar1 = ref_solution <= nVar5;
  }
  if (!bVar1) {
    __assert_fail("viennamath::eval(e, p) <= ref_solution && viennamath::eval(e, p) >= ref_solution"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/viennamath[P]viennamath-dev/tests/src/runtime_test.cpp"
                  ,0x45,"void evaluations_test(E &, double) [E = viennamath::rt_expr<>]");
  }
  if ((local_81 & 1) != 0) {
    viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::~rt_expr(&local_80);
  }
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::~rt_expr(&local_78);
  poVar3 = viennamath::operator<<((ostream *)&std::cout,e);
  poVar3 = std::operator<<(poVar3," at vector_3 (");
  viennamath::
  make_vector<viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>
            (&local_b0,(viennamath *)&c6.s,
             (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)local_38,
             (rt_constant<long,_viennamath::rt_expression_interface<double>_> *)
             ((long)&p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3),in_R8);
  poVar3 = viennamath::operator<<(poVar3,&local_b0);
  poVar3 = std::operator<<(poVar3,")");
  poVar3 = std::operator<<(poVar3," = ");
  viennamath::
  make_vector<viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>
            (&local_d8,(viennamath *)&c6.s,
             (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)local_38,
             (rt_constant<long,_viennamath::rt_expression_interface<double>_> *)
             ((long)&p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3),in_R8);
  nVar4 = viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator()
                    ((rt_expr<viennamath::rt_expression_interface<double>> *)e,&local_d8);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,nVar4);
  poVar3 = std::operator<<(poVar3," = ");
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr(&local_e0,e);
  viennamath::
  make_vector<viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>
            (&local_108,(viennamath *)&c6.s,
             (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)local_38,
             (rt_constant<long,_viennamath::rt_expression_interface<double>_> *)
             ((long)&p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3),in_R8);
  nVar5 = viennamath::
          eval<viennamath::rt_expression_interface<double>,viennamath::ct_vector_3<viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>>
                    (&local_e0,&local_108);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,nVar5);
  poVar3 = std::operator<<(poVar3," (reference solution: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,ref_solution);
  poVar3 = std::operator<<(poVar3,")");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  viennamath::
  ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
  ::~ct_vector_3(&local_108);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::~rt_expr(&local_e0);
  viennamath::
  ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
  ::~ct_vector_3(&local_d8);
  viennamath::
  ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
  ::~ct_vector_3(&local_b0);
  local_141 = 0;
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr(&local_110,e);
  viennamath::
  make_vector<viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>
            (&local_138,(viennamath *)&c6.s,
             (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)local_38,
             (rt_constant<long,_viennamath::rt_expression_interface<double>_> *)
             ((long)&p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3),in_R8);
  nVar5 = viennamath::
          eval<viennamath::rt_expression_interface<double>,viennamath::ct_vector_3<viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>>
                    (&local_110,&local_138);
  bVar1 = false;
  if (nVar5 <= ref_solution) {
    viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr(&local_140,e);
    local_141 = 1;
    viennamath::
    make_vector<viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>
              (&local_170,(viennamath *)&c6.s,
               (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)local_38,
               (rt_constant<long,_viennamath::rt_expression_interface<double>_> *)
               ((long)&p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 3),in_R8);
    nVar6 = viennamath::
            eval<viennamath::rt_expression_interface<double>,viennamath::ct_vector_3<viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>>
                      (&local_140,&local_170);
    bVar1 = ref_solution <= nVar6;
  }
  if (bVar1) {
    if (nVar5 <= ref_solution) {
      viennamath::
      ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
      ::~ct_vector_3(&local_170);
    }
    if ((local_141 & 1) != 0) {
      viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::~rt_expr(&local_140);
    }
    viennamath::
    ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
    ::~ct_vector_3(&local_138);
    viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::~rt_expr(&local_110);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_60);
    viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>::~rt_constant
              ((rt_constant<long,_viennamath::rt_expression_interface<double>_> *)local_38);
    viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>::~rt_constant
              ((rt_constant<double,_viennamath::rt_expression_interface<double>_> *)&c6.s);
    return;
  }
  __assert_fail("viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) <= ref_solution && viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) >= ref_solution"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/viennamath[P]viennamath-dev/tests/src/runtime_test.cpp"
                ,0x4b,"void evaluations_test(E &, double) [E = viennamath::rt_expr<>]");
}

Assistant:

void evaluations_test(E & e, double ref_solution)
{
  viennamath::rt_constant<double> c4(4.0);
  viennamath::rt_constant<long> c6(6);
  viennamath::ct_constant<8> c8;

  std::vector<double> p(3);
  p[0] = 4;
  p[1] = 6;
  p[2] = 8;


  std::cout << e << " at STL (" << p[0] << ", " << p[1] << ", " << p[2] << ")"
            << " = " << e(p)
            << " = " << viennamath::eval(e,p)
            << " (reference solution: " << ref_solution << ")" << std::endl;
  assert(viennamath::eval(e, p) <= ref_solution && viennamath::eval(e, p) >= ref_solution);

  std::cout << e << " at vector_3 (" << viennamath::make_vector(c4, c6, c8) << ")"
            << " = " << e(viennamath::make_vector(c4, c6, c8))
            << " = " << viennamath::eval(e, viennamath::make_vector(c4, c6, c8))
            << " (reference solution: " << ref_solution << ")" << std::endl;
  assert(viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) <= ref_solution && viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) >= ref_solution);

}